

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall
glslang::TRemapIdTraverser::visitSymbol(TRemapIdTraverser *this,TIntermSymbol *symbol)

{
  TIdMaps *pTVar1;
  int iVar2;
  TShaderInterface TVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  TString *__k;
  const_iterator cVar5;
  uint extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar6;
  ulong uVar7;
  
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar2));
  uVar6 = (uint)*(ulong *)(lVar4 + 8);
  if ((((uVar6 & 0x7f) < 8) && ((0xfaU >> (uVar6 & 0x1f) & 1) != 0)) ||
     ((*(ulong *)(lVar4 + 8) & 0xff80) != 0)) {
    iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    TVar3 = TType::getShaderInterface((TType *)CONCAT44(extraout_var_00,iVar2));
    pTVar1 = this->idMaps;
    __k = getNameForIdMap_abi_cxx11_(symbol);
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
                    *)(pTVar1->maps + TVar3),__k);
    if ((_Rb_tree_header *)cVar5._M_node !=
        &this->idMaps->maps[TVar3].
         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
         ._M_t._M_impl.super__Rb_tree_header) {
      (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
      uVar7 = (ulong)cVar5._M_node[2]._M_parent & 0xffffffffffffff |
              ((ulong)extraout_var_01 & 0xff000000) << 0x20;
      goto LAB_0037bf9f;
    }
  }
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
  uVar7 = CONCAT44(extraout_var_02,iVar2) + this->idShift;
LAB_0037bf9f:
  (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x31])(symbol,uVar7);
  return;
}

Assistant:

virtual void visitSymbol(TIntermSymbol* symbol)
    {
        const TQualifier& qualifier = symbol->getType().getQualifier();
        bool remapped = false;
        if (qualifier.isLinkable() || qualifier.builtIn != EbvNone) {
            TShaderInterface si = symbol->getType().getShaderInterface();
            auto it = idMaps[si].find(getNameForIdMap(symbol));
            if (it != idMaps[si].end()) {
                uint64_t id = (symbol->getId() & ~TSymbolTable::uniqueIdMask) |
                    (it->second & TSymbolTable::uniqueIdMask);
                symbol->changeId(id);
                remapped = true;
            }
        }
        if (!remapped)
            symbol->changeId(symbol->getId() + idShift);
    }